

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm * whereScanNext(WhereScan *pScan)

{
  short sVar1;
  int iTab;
  Parse *pParse;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  Expr *pEVar5;
  CollSeq *pCVar6;
  ulong uVar7;
  uint uVar8;
  WhereClause *pWVar9;
  WhereTerm *pWVar10;
  int iVar11;
  
  iVar11 = pScan->k;
  pWVar9 = pScan->pWC;
  bVar2 = pScan->iEquiv;
  do {
    sVar1 = pScan->aiColumn[(ulong)bVar2 - 1];
    iTab = pScan->aiCur[(ulong)bVar2 - 1];
    do {
      pWVar10 = pWVar9->a + iVar11;
      for (; iVar11 < pWVar9->nTerm; iVar11 = iVar11 + 1) {
        if ((((pWVar10->leftCursor == iTab) && ((pWVar10->u).x.leftColumn == (int)sVar1)) &&
            ((sVar1 != -2 ||
             (iVar3 = sqlite3ExprCompareSkip(pWVar10->pExpr->pLeft,pScan->pIdxExpr,iTab), iVar3 == 0
             )))) && ((pScan->iEquiv < 2 || ((pWVar10->pExpr->flags & 1) == 0)))) {
          uVar8._0_2_ = pWVar10->eOperator;
          uVar8._2_1_ = pWVar10->nChild;
          uVar8._3_1_ = pWVar10->eMatchOp;
          if ((uVar8 >> 0xb & 1) != 0) {
            bVar2 = pScan->nEquiv;
            uVar4 = (ulong)bVar2;
            if ((((uVar4 < 0xb) &&
                 (pEVar5 = sqlite3ExprSkipCollateAndLikely(pWVar10->pExpr->pRight),
                 pEVar5 != (Expr *)0x0)) && (pEVar5->op == 0xa7)) && ((pEVar5->flags & 0x20) == 0))
            {
              for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
                if ((pScan->aiCur[uVar7] == pEVar5->iTable) &&
                   (pScan->aiColumn[uVar7] == pEVar5->iColumn)) {
                  if (uVar4 != uVar7) goto LAB_001aabfd;
                  break;
                }
              }
              pScan->aiCur[uVar4] = pEVar5->iTable;
              pScan->aiColumn[uVar4] = pEVar5->iColumn;
              pScan->nEquiv = bVar2 + 1;
              uVar8 = (uint)pWVar10->eOperator;
            }
          }
LAB_001aabfd:
          if ((pScan->opMask & uVar8 & 0xffff) != 0) {
            if ((((uVar8 & 0xffff) >> 8 & 1) == 0) && (pScan->zCollName != (char *)0x0)) {
              pParse = pWVar9->pWInfo->pParse;
              pEVar5 = pWVar10->pExpr;
              iVar3 = sqlite3IndexAffinityOk(pEVar5,pScan->idxaff);
              if (iVar3 != 0) {
                pCVar6 = sqlite3ExprCompareCollSeq(pParse,pEVar5);
                if (pCVar6 == (CollSeq *)0x0) {
                  pCVar6 = pParse->db->pDfltColl;
                }
                iVar3 = sqlite3StrICmp(pCVar6->zName,pScan->zCollName);
                if (iVar3 == 0) {
                  uVar8 = (uint)pWVar10->eOperator;
                  goto LAB_001aac71;
                }
              }
            }
            else {
LAB_001aac71:
              if (((((uVar8 & 0x82) == 0) ||
                   (pEVar5 = pWVar10->pExpr->pRight, pEVar5 == (Expr *)0x0)) || (pEVar5->op != 0xa7)
                  ) || ((pEVar5->iTable != pScan->aiCur[0] ||
                        (pEVar5->iColumn != pScan->aiColumn[0])))) {
                pScan->pWC = pWVar9;
                pScan->k = iVar11 + 1;
                return pWVar10;
              }
            }
          }
        }
        pWVar10 = pWVar10 + 1;
      }
      pWVar9 = pWVar9->pOuter;
      iVar11 = 0;
    } while (pWVar9 != (WhereClause *)0x0);
    if (pScan->nEquiv <= pScan->iEquiv) {
      return (WhereTerm *)0x0;
    }
    pWVar9 = pScan->pOrigWC;
    bVar2 = pScan->iEquiv + 1;
    pScan->iEquiv = bVar2;
    iVar11 = 0;
  } while( true );
}

Assistant:

static WhereTerm *whereScanNext(WhereScan *pScan){
  int iCur;            /* The cursor on the LHS of the term */
  i16 iColumn;         /* The column on the LHS of the term.  -1 for IPK */
  Expr *pX;            /* An expression being tested */
  WhereClause *pWC;    /* Shorthand for pScan->pWC */
  WhereTerm *pTerm;    /* The term being tested */
  int k = pScan->k;    /* Where to start scanning */

  assert( pScan->iEquiv<=pScan->nEquiv );
  pWC = pScan->pWC;
  while(1){
    iColumn = pScan->aiColumn[pScan->iEquiv-1];
    iCur = pScan->aiCur[pScan->iEquiv-1];
    assert( pWC!=0 );
    assert( iCur>=0 );
    do{
      for(pTerm=pWC->a+k; k<pWC->nTerm; k++, pTerm++){
        assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 || pTerm->leftCursor<0 );
        if( pTerm->leftCursor==iCur
         && pTerm->u.x.leftColumn==iColumn
         && (iColumn!=XN_EXPR
             || sqlite3ExprCompareSkip(pTerm->pExpr->pLeft,
                                       pScan->pIdxExpr,iCur)==0)
         && (pScan->iEquiv<=1 || !ExprHasProperty(pTerm->pExpr, EP_OuterON))
        ){
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && pScan->nEquiv<ArraySize(pScan->aiCur)
           && (pX = whereRightSubexprIsColumn(pTerm->pExpr))!=0
          ){
            int j;
            for(j=0; j<pScan->nEquiv; j++){
              if( pScan->aiCur[j]==pX->iTable
               && pScan->aiColumn[j]==pX->iColumn ){
                  break;
              }
            }
            if( j==pScan->nEquiv ){
              pScan->aiCur[j] = pX->iTable;
              pScan->aiColumn[j] = pX->iColumn;
              pScan->nEquiv++;
            }
          }
          if( (pTerm->eOperator & pScan->opMask)!=0 ){
            /* Verify the affinity and collating sequence match */
            if( pScan->zCollName && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              Parse *pParse = pWC->pWInfo->pParse;
              pX = pTerm->pExpr;
              if( !sqlite3IndexAffinityOk(pX, pScan->idxaff) ){
                continue;
              }
              assert(pX->pLeft);
              pColl = sqlite3ExprCompareCollSeq(pParse, pX);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
              if( sqlite3StrICmp(pColl->zName, pScan->zCollName) ){
                continue;
              }
            }
            if( (pTerm->eOperator & (WO_EQ|WO_IS))!=0
             && (pX = pTerm->pExpr->pRight, ALWAYS(pX!=0))
             && pX->op==TK_COLUMN
             && pX->iTable==pScan->aiCur[0]
             && pX->iColumn==pScan->aiColumn[0]
            ){
              testcase( pTerm->eOperator & WO_IS );
              continue;
            }
            pScan->pWC = pWC;
            pScan->k = k+1;
#ifdef WHERETRACE_ENABLED
            if( sqlite3WhereTrace & 0x20000 ){
              int ii;
              sqlite3DebugPrintf("SCAN-TERM %p: nEquiv=%d",
                 pTerm, pScan->nEquiv);
              for(ii=0; ii<pScan->nEquiv; ii++){
                sqlite3DebugPrintf(" {%d:%d}",
                   pScan->aiCur[ii], pScan->aiColumn[ii]);
              }
              sqlite3DebugPrintf("\n");
            }
#endif
            return pTerm;
          }
        }
      }
      pWC = pWC->pOuter;
      k = 0;
    }while( pWC!=0 );
    if( pScan->iEquiv>=pScan->nEquiv ) break;
    pWC = pScan->pOrigWC;
    k = 0;
    pScan->iEquiv++;
  }
  return 0;
}